

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_write_header(HTTP_INFO *hi)

{
  int iVar1;
  int iVar2;
  char request [4096];
  
  if (hi != (HTTP_INFO *)0x0) {
    iVar1 = snprintf(request,0x400,
                     "%s %s HTTP/1.1\r\nUser-Agent: Mozilla/5.0 (X11; Linux x86_64) AppleWebKit/537.36 (KHTML, like Gecko) Ubuntu Chromium/49.0.2623.108 Chrome/49.0.2623.108 Safari/537.36\r\nHost: %s:%s\r\nContent-Type: %s\r\n"
                     ,&hi->request,(hi->url).path,(hi->url).host,(hi->url).port,
                     (hi->request).content_type);
    if ((hi->request).referrer[0] != '\0') {
      iVar2 = snprintf(request + iVar1,0x200,"Referer: %s\r\n",(hi->request).referrer);
      iVar1 = iVar1 + iVar2;
    }
    if ((hi->request).chunked == '\x01') {
      builtin_strncpy(request + (long)iVar1 + 0xd,"ding: ch",8);
      builtin_strncpy(request + (long)iVar1 + 0x15,"unked\r\n",8);
      builtin_strncpy(request + iVar1,"Transfer",8);
      builtin_strncpy(request + (long)iVar1 + 8,"-Encodin",8);
      iVar1 = iVar1 + 0x1c;
    }
    else {
      iVar2 = snprintf(request + iVar1,0x200,"Content-Length: %ld\r\n",(hi->request).content_length)
      ;
      iVar1 = iVar1 + iVar2;
    }
    if ((hi->request).close == '\x01') {
      builtin_strncpy(request + iVar1,"Conn",4);
      builtin_strncpy(request + (long)iVar1 + 4,"ecti",4);
      builtin_strncpy(request + (long)iVar1 + 8,"on: ",4);
      builtin_strncpy(request + (long)iVar1 + 0xc,"clos",4);
      builtin_strncpy(request + (long)iVar1 + 0x10,"e\r\n",4);
      iVar2 = 0x13;
    }
    else {
      builtin_strncpy(request + (long)iVar1 + 9,"n: Keep-",8);
      builtin_strncpy(request + (long)iVar1 + 0x11,"Alive\r\n",8);
      builtin_strncpy(request + iVar1,"Conn",4);
      builtin_strncpy(request + (long)iVar1 + 4,"ecti",4);
      builtin_strncpy(request + (long)iVar1 + 8,"on: ",4);
      builtin_strncpy(request + (long)iVar1 + 0xc,"Keep",4);
      iVar2 = 0x18;
    }
    iVar1 = iVar1 + iVar2;
    if ((hi->request).cookie[0] != '\0') {
      iVar2 = snprintf(request + iVar1,0x200,"Cookie: %s\r\n",(hi->request).cookie);
      iVar1 = iVar1 + iVar2;
    }
    request[(long)iVar1 + 2] = '\0';
    (request + iVar1)[0] = '\r';
    (request + iVar1)[1] = '\n';
    printf("%s",request);
    iVar2 = https_write(hi,request,iVar1 + 2);
    if (iVar2 == iVar1 + 2) {
      return 0;
    }
    https_close(hi);
    _error = iVar2;
  }
  return -1;
}

Assistant:

int http_write_header(HTTP_INFO *hi)
{
    char        request[4096], buf[H_FIELD_SIZE];
    int         ret, len, l;


    if (NULL == hi) return -1;

    /* Send HTTP request. */
    len = snprintf(request, 1024,
                   "%s %s HTTP/1.1\r\n"
                   "User-Agent: Mozilla/5.0 (X11; Linux x86_64) AppleWebKit/537.36 (KHTML, like Gecko) Ubuntu Chromium/49.0.2623.108 Chrome/49.0.2623.108 Safari/537.36\r\n"
                   "Host: %s:%s\r\n"
                   "Content-Type: %s\r\n",
                   hi->request.method, hi->url.path,
                   hi->url.host, hi->url.port,
                   hi->request.content_type);


    if(hi->request.referrer[0] != 0)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Referer: %s\r\n", hi->request.referrer);
    }

    if(hi->request.chunked == TRUE)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Transfer-Encoding: chunked\r\n");
    }
    else
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Content-Length: %ld\r\n", hi->request.content_length);
    }

    if(hi->request.close == TRUE)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Connection: close\r\n");
    }
    else
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Connection: Keep-Alive\r\n");
    }

    if(hi->request.cookie[0] != 0)
    {
        len += snprintf(&request[len], H_FIELD_SIZE,
                        "Cookie: %s\r\n", hi->request.cookie);
    }

    len += snprintf(&request[len], H_FIELD_SIZE, "\r\n");


    printf("%s", request);

    if ((ret = https_write(hi, request, len)) != len)
    {
        https_close(hi);

        _error = ret;

        return -1;
    }

    return 0;
}